

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double chi_mean(double a,double b,double c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double mean;
  double c_local;
  double b_local;
  double a_local;
  
  dVar1 = sqrt(2.0);
  dVar2 = tgamma((c + 1.0) * 0.5);
  dVar3 = tgamma(c * 0.5);
  return a + (dVar1 * b * dVar2) / dVar3;
}

Assistant:

double chi_mean ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_MEAN returns the mean of the Chi PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double MEAN, the mean value.
//
{
  double mean;

  mean = a + sqrt ( 2.0 ) * b * tgamma ( 0.5 * ( c + 1.0 ) )
  / tgamma ( 0.5 * c );

  return mean;
}